

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_attr<std::vector<long,std::allocator<long>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *attr,
          string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  uint32_t indent_00;
  long lVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  tinyusdz tVar8;
  undefined1 uVar9;
  bool bVar10;
  bool bVar11;
  vector<long,_std::allocator<long>_> a;
  stringstream ss;
  string local_268;
  string *local_240;
  uint32_t local_234;
  TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *local_230;
  string *local_228;
  undefined1 local_220 [8];
  vector<long,_std::allocator<long>_> local_218;
  undefined1 local_200;
  undefined1 local_1ff;
  TypedTimeSamples<std::vector<long,_std::allocator<long>_>_> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_240 = name;
  local_230 = attr;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  lVar6 = *(long *)(this + 0x218);
  if (lVar6 == *(long *)(this + 0x210) && tVar2 == (tinyusdz)0x0) {
    if ((this[0x208] == (tinyusdz)0x0) && (((byte)this[0x270] & 1) == 0)) goto LAB_002dddd0;
    lVar7 = lVar6;
    if (((byte)this[0x270] & 1) == 0) {
      tVar8 = this[0x208];
    }
    else {
      tVar8 = (tinyusdz)0x0;
    }
  }
  else {
    tVar8 = (tinyusdz)0x0;
    lVar7 = *(long *)(this + 0x210);
  }
  bVar10 = lVar6 != lVar7;
  local_228 = __return_storage_ptr__;
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
  ::optional((optional<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)local_220
             ,(optional<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
              (this + 0x228));
  uVar9 = local_200;
  indent_00 = (uint32_t)lVar7;
  if (local_220[0] == true) {
    if (local_1f8._dirty == true) {
      TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::update(&local_1f8);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_1f8._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_234 = indent_00;
  }
  else {
    uVar9 = '\0';
    local_234 = 0;
  }
  if ((((local_220[0] & 1U) == 0) || (local_1ff != '\0')) || (local_200 != '\0')) {
    bVar11 = false;
  }
  else {
    bVar11 = local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_1f8._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<long,_std::allocator<long>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar4 = AttrMetas::authored((AttrMetas *)this);
  if (((bVar4) || ((byte)(bVar10 & ((byte)tVar2 ^ 1) | bVar11) != 1)) ||
     (n_01 = n, (tVar8 != (tinyusdz)0x0 || this[0x270] != (tinyusdz)0x0) || uVar9 != '\0')) {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_240,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    value::TypeTraits<std::vector<long,std::allocator<long>>>::type_name_abi_cxx11_();
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (this[0x270] == (tinyusdz)0x1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else if (uVar9 != '\0') {
      local_268._M_dataplus._M_p = (char *)0x0;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      if (local_220[0] == false) goto LAB_002dde29;
      if ((local_1ff == '\0') && (local_200 == '\x01')) {
        std::vector<long,_std::allocator<long>_>::operator=
                  ((vector<long,_std::allocator<long>_> *)&local_268,&local_218);
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        ::std::operator<<(local_1a8,(vector<long,_std::allocator<long>_> *)&local_268);
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = [InternalError]",0x12);
      }
      if (local_268._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_268._M_dataplus._M_p,
                        local_268.field_2._M_allocated_capacity - (long)local_268._M_dataplus._M_p);
      }
    }
    bVar10 = AttrMetas::authored((AttrMetas *)this);
    if (bVar10) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      psVar3 = local_240;
      print_attr_metas_abi_cxx11_(&local_268,this,(AttrMeta *)(ulong)((int)local_240 + 1),indent_00)
      ;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar3 & 0xffffffff),n_00);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_234 != '\0') {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_240,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    value::TypeTraits<std::vector<long,std::allocator<long>>>::type_name_abi_cxx11_();
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_220[0] == false) {
LAB_002dde29:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<long>>>::value() const [T = tinyusdz::Animatable<std::vector<long>>]"
                   );
    }
    print_typed_timesamples<std::vector<long,std::allocator<long>>>
              (&local_268,(tinyusdz *)&local_1f8,
               (TypedTimeSamples<std::vector<long,_std::allocator<long>_>_> *)local_240,indent_00);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_240,n_01);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    value::TypeTraits<std::vector<long,std::allocator<long>>>::type_name_abi_cxx11_();
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(char *)(local_230->_metas).interpolation,
               (long)(local_230->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar6 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar6 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar6 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  __return_storage_ptr__ = local_228;
  if (local_220[0] == true) {
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>::destruct_value
              ((storage_t<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
               &local_218);
    __return_storage_ptr__ = local_228;
  }
LAB_002dddd0:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}